

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall fmt::v8::format_int::format_signed<int>(format_int *this,int value)

{
  char *pcVar1;
  char *local_28;
  char *begin;
  uint local_18;
  bool negative;
  uint32_or_64_or_128_t<int> abs_value;
  int value_local;
  format_int *this_local;
  
  local_18 = value;
  if (value < 0) {
    local_18 = -value;
  }
  pcVar1 = format_unsigned<unsigned_int>(this,local_18);
  local_28 = pcVar1;
  if (value < 0) {
    local_28 = pcVar1 + -1;
    pcVar1[-1] = '-';
  }
  return local_28;
}

Assistant:

auto format_signed(Int value) -> char* {
    auto abs_value = static_cast<detail::uint32_or_64_or_128_t<Int>>(value);
    bool negative = value < 0;
    if (negative) abs_value = 0 - abs_value;
    auto begin = format_unsigned(abs_value);
    if (negative) *--begin = '-';
    return begin;
  }